

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O2

void __thiscall
qclab::qgates::SWAP<std::complex<float>_>::apply
          (SWAP<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  uint __line;
  char *__assertion;
  int target;
  int control;
  CNOT<std::complex<float>_> cnot01;
  CNOT<std::complex<float>_> cnot10;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x24;
  }
  else if (matrix->size_ == (long)(1 << ((byte)nbQubits & 0x1f))) {
    control = (this->qubits_)._M_elems[0] + offset;
    if (control < nbQubits) {
      target = offset + (this->qubits_)._M_elems[1];
      if (target < nbQubits) {
        CX<std::complex<float>_>::CX(&cnot01,control,target,1);
        CX<std::complex<float>_>::CX(&cnot10,target,control,1);
        CX<std::complex<float>_>::apply(&cnot01,side,op,nbQubits,matrix,0);
        CX<std::complex<float>_>::apply(&cnot10,side,op,nbQubits,matrix,0);
        CX<std::complex<float>_>::apply(&cnot01,side,op,nbQubits,matrix,0);
        CX<std::complex<float>_>::~CX(&cnot10);
        CX<std::complex<float>_>::~CX(&cnot01);
        return;
      }
      __assertion = "qubit1 < nbQubits";
    }
    else {
      __assertion = "qubit0 < nbQubits";
    }
    __line = 0x28;
  }
  else {
    __assertion = "matrix.size() == 1 << nbQubits";
    __line = 0x25;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                ,__line,
                "virtual void qclab::qgates::SWAP<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void SWAP< T >::apply( Side side , Op op , const int nbQubits ,
                         qclab::dense::SquareMatrix< T >& matrix ,
                         const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit0 = qubits_[0] + offset ;
    const int qubit1 = qubits_[1] + offset ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    // 3x CNOT
    qclab::qgates::CNOT< T > cnot01( qubit0 , qubit1 ) ;
    qclab::qgates::CNOT< T > cnot10( qubit1 , qubit0 ) ;
    cnot01.apply( side , op , nbQubits , matrix ) ;
    cnot10.apply( side , op , nbQubits , matrix ) ;
    cnot01.apply( side , op , nbQubits , matrix ) ;
  }